

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O2

RealType __thiscall
OpenMD::EAM::Rho(EAM *this,RealType r,RealType re,RealType fe,RealType beta,RealType lambda)

{
  EAMMixingMethod EVar1;
  double dVar2;
  RealType RVar3;
  
  EVar1 = this->mixMeth_;
  if ((EVar1 == eamJohnson) || (EVar1 == eamDream1)) {
    dVar2 = exp((r / re + -1.0) * -beta);
    RVar3 = fastPower(this,r / re - lambda,0x14);
    RVar3 = (dVar2 * fe) / (RVar3 + 1.0);
  }
  else {
    RVar3 = 0.0;
    if (EVar1 == eamDream2) {
      dVar2 = exp((r / re + -1.0) * -beta);
      RVar3 = dVar2 * fe;
    }
  }
  return RVar3;
}

Assistant:

RealType EAM::Rho(RealType r, RealType re, RealType fe, RealType beta,
                    RealType lambda) {
    if (mixMeth_ == eamDream2) {
      return (fe * exp(-beta * (r / re - 1.0)));
    }

    else if ((mixMeth_ == eamDream1) || (mixMeth_ == eamJohnson)) {
      return (fe * exp(-beta * (r / re - 1.0))) /
             (1.0 + fastPower(r / re - lambda, 20));
    }

    else
      return 0;
  }